

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitCallRef(PrintExpressionContents *this,CallRef *curr)

{
  ostream *o;
  bool bVar1;
  HeapType type;
  char *str;
  
  bVar1 = printUnreachableOrNullReplacement(this,curr->target);
  if (bVar1) {
    return;
  }
  str = "call_ref ";
  if (curr->isReturn != false) {
    str = "return_call_ref ";
  }
  printMedium(this->o,str);
  o = this->o;
  type = wasm::Type::getHeapType(&curr->target->type);
  anon_unknown_217::printHeapType(o,type,this->wasm);
  return;
}

Assistant:

void visitCallRef(CallRef* curr) {
    // TODO: Workaround if target has bottom type.
    if (printUnreachableOrNullReplacement(curr->target)) {
      return;
    }
    printMedium(o, curr->isReturn ? "return_call_ref " : "call_ref ");
    printHeapType(o, curr->target->type.getHeapType(), wasm);
  }